

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_extension.cc
# Opt level: O2

void google::protobuf::compiler::java::ExtensionGenerator::InitTemplateVars
               (FieldDescriptor *descriptor,string *scope,bool immutable,
               ClassNameResolver *name_resolver,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *vars_pointer)

{
  int iVar1;
  Type field_type;
  JavaType type;
  mapped_type *pmVar2;
  char *pcVar3;
  EnumDescriptor *descriptor_00;
  Descriptor *descriptor_01;
  int i;
  int __c;
  int i_00;
  FieldDescriptor *field;
  FieldDescriptor *field_00;
  key_type *__s;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *name_resolver_00;
  string singular_type;
  key_type local_c0;
  key_type local_a0;
  allocator local_7a;
  allocator local_79;
  ClassNameResolver *local_78;
  key_type local_70;
  key_type local_50;
  
  name_resolver_00 = vars_pointer;
  local_78 = name_resolver;
  std::__cxx11::string::string((string *)&local_c0,"scope",(allocator *)&local_a0);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](vars_pointer,&local_c0);
  std::__cxx11::string::_M_assign((string *)pmVar2);
  std::__cxx11::string::~string((string *)&local_c0);
  UnderscoresToCamelCase_abi_cxx11_(&local_c0,(java *)descriptor,field);
  std::__cxx11::string::string((string *)&local_a0,"name",(allocator *)&local_70);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](vars_pointer,&local_a0);
  std::__cxx11::string::operator=((string *)pmVar2,(string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  ClassNameResolver::GetClassName_abi_cxx11_
            (&local_c0,local_78,*(Descriptor **)(descriptor + 0x58),immutable);
  std::__cxx11::string::string((string *)&local_a0,"containing_type",(allocator *)&local_70);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](vars_pointer,&local_a0);
  std::__cxx11::string::operator=((string *)pmVar2,(string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  SimpleItoa_abi_cxx11_(&local_c0,(protobuf *)(ulong)*(uint *)(descriptor + 0x38),i);
  std::__cxx11::string::string((string *)&local_a0,"number",(allocator *)&local_70);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](vars_pointer,&local_a0);
  std::__cxx11::string::operator=((string *)pmVar2,(string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  FieldConstantName_abi_cxx11_(&local_c0,(java *)descriptor,field_00);
  std::__cxx11::string::string((string *)&local_a0,"constant_name",(allocator *)&local_70);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](vars_pointer,&local_a0);
  __s = &local_c0;
  std::__cxx11::string::operator=((string *)pmVar2,(string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  pcVar3 = FieldDescriptor::index(descriptor,(char *)__s,__c);
  SimpleItoa_abi_cxx11_(&local_c0,(protobuf *)((ulong)pcVar3 & 0xffffffff),i_00);
  std::__cxx11::string::string((string *)&local_a0,"index",(allocator *)&local_70);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](vars_pointer,&local_a0);
  std::__cxx11::string::operator=((string *)pmVar2,(string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  if (*(int *)(descriptor + 0x4c) == 3) {
    std::__cxx11::string::string((string *)&local_c0,"",&local_79);
  }
  else {
    DefaultValue_abi_cxx11_
              (&local_c0,(java *)descriptor,(FieldDescriptor *)(ulong)immutable,SUB81(local_78,0),
               (ClassNameResolver *)name_resolver_00);
  }
  std::__cxx11::string::string((string *)&local_a0,"default",(allocator *)&local_70);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](vars_pointer,&local_a0);
  std::__cxx11::string::operator=((string *)pmVar2,(string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  field_type = GetType(descriptor);
  FieldTypeName(field_type);
  std::__cxx11::string::string((string *)&local_c0,"type_constant",(allocator *)&local_a0);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](vars_pointer,&local_c0);
  std::__cxx11::string::assign((char *)pmVar2);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::string((string *)&local_c0,"packed",(allocator *)&local_a0);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](vars_pointer,&local_c0);
  std::__cxx11::string::assign((char *)pmVar2);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::string((string *)&local_c0,"enum_map",(allocator *)&local_a0);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](vars_pointer,&local_c0);
  std::__cxx11::string::assign((char *)pmVar2);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::string((string *)&local_c0,"prototype",(allocator *)&local_a0);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](vars_pointer,&local_c0);
  std::__cxx11::string::assign((char *)pmVar2);
  std::__cxx11::string::~string((string *)&local_c0);
  type = GetJavaType(descriptor);
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  local_c0._M_string_length = 0;
  local_c0.field_2._M_local_buf[0] = '\0';
  switch(type) {
  case JAVATYPE_STRING:
    break;
  case JAVATYPE_BYTES:
    break;
  case JAVATYPE_ENUM:
    descriptor_00 = FieldDescriptor::enum_type(descriptor);
    ClassNameResolver::GetClassName_abi_cxx11_(&local_a0,local_78,descriptor_00,immutable);
    std::__cxx11::string::operator=((string *)&local_c0,(string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    std::operator+(&local_a0,&local_c0,".internalGetValueMap()");
    std::__cxx11::string::string((string *)&local_70,"enum_map",(allocator *)&local_50);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](vars_pointer,&local_70);
    goto LAB_002a9929;
  case JAVATYPE_MESSAGE:
    descriptor_01 = FieldDescriptor::message_type(descriptor);
    ClassNameResolver::GetClassName_abi_cxx11_(&local_a0,local_78,descriptor_01,immutable);
    std::__cxx11::string::operator=((string *)&local_c0,(string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    std::operator+(&local_a0,&local_c0,".getDefaultInstance()");
    std::__cxx11::string::string((string *)&local_70,"prototype",(allocator *)&local_50);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](vars_pointer,&local_70);
LAB_002a9929:
    std::__cxx11::string::operator=((string *)pmVar2,(string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_a0);
    goto LAB_002a9982;
  default:
    BoxedPrimitiveTypeName(type);
    std::__cxx11::string::assign((char *)&local_c0);
    goto LAB_002a9982;
  }
  std::__cxx11::string::assign((char *)&local_c0);
LAB_002a9982:
  iVar1 = *(int *)(descriptor + 0x4c);
  if (iVar1 == 3) {
    std::operator+(&local_70,"java.util.List<",&local_c0);
    std::operator+(&local_a0,&local_70,">");
  }
  else {
    std::__cxx11::string::string((string *)&local_a0,(string *)&local_c0);
  }
  std::__cxx11::string::string((string *)&local_50,"type",&local_7a);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](vars_pointer,&local_50);
  std::__cxx11::string::operator=((string *)pmVar2,(string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_a0);
  if (iVar1 == 3) {
    std::__cxx11::string::~string((string *)&local_70);
  }
  std::__cxx11::string::string((string *)&local_a0,"singular_type",(allocator *)&local_50);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](vars_pointer,&local_a0);
  std::__cxx11::string::_M_assign((string *)pmVar2);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  return;
}

Assistant:

void ExtensionGenerator::InitTemplateVars(
    const FieldDescriptor* descriptor, const string& scope, bool immutable,
    ClassNameResolver* name_resolver, std::map<string, string>* vars_pointer) {
  std::map<string, string> &vars = *vars_pointer;
  vars["scope"] = scope;
  vars["name"] = UnderscoresToCamelCase(descriptor);
  vars["containing_type"] =
      name_resolver->GetClassName(descriptor->containing_type(), immutable);
  vars["number"] = SimpleItoa(descriptor->number());
  vars["constant_name"] = FieldConstantName(descriptor);
  vars["index"] = SimpleItoa(descriptor->index());
  vars["default"] = descriptor->is_repeated() ?
      "" : DefaultValue(descriptor, immutable, name_resolver);
  vars["type_constant"] = FieldTypeName(GetType(descriptor));
  vars["packed"] = descriptor->options().packed() ? "true" : "false";
  vars["enum_map"] = "null";
  vars["prototype"] = "null";

  JavaType java_type = GetJavaType(descriptor);
  string singular_type;
  switch (java_type) {
    case JAVATYPE_MESSAGE:
      singular_type = name_resolver->GetClassName(descriptor->message_type(),
                                                   immutable);
      vars["prototype"] = singular_type + ".getDefaultInstance()";
      break;
    case JAVATYPE_ENUM:
      singular_type = name_resolver->GetClassName(descriptor->enum_type(),
                                                   immutable);
      vars["enum_map"] = singular_type + ".internalGetValueMap()";
      break;
    case JAVATYPE_STRING:
      singular_type = "java.lang.String";
      break;
    case JAVATYPE_BYTES:
      singular_type = immutable ? "com.google.protobuf.ByteString" : "byte[]";
      break;
    default:
      singular_type = BoxedPrimitiveTypeName(java_type);
      break;
  }
  vars["type"] = descriptor->is_repeated() ?
      "java.util.List<" + singular_type + ">" : singular_type;
  vars["singular_type"] = singular_type;
}